

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

u32 crc32_slice8(u32 crc,u8 *p,size_t len)

{
  uint uVar1;
  uint uVar2;
  u32 uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  uint *puVar7;
  u8 *puVar8;
  ulong uVar9;
  
  uVar4 = (ulong)crc;
  lVar5 = 0;
  puVar7 = (uint *)p;
  puVar8 = p;
  for (sVar6 = len; (((ulong)puVar8 & 7) != 0 && (sVar6 != 0)); sVar6 = sVar6 - 1) {
    uVar4 = (ulong)((uint)(uVar4 >> 8) ^
                   crc32_slice8_table[(uint)(byte)*puVar7 ^ (uint)uVar4 & 0xff]);
    puVar7 = (uint *)((long)puVar7 + 1);
    lVar5 = lVar5 + 1;
    puVar8 = puVar8 + 1;
  }
  for (uVar9 = sVar6 & 0xfffffffffffffff8; uVar9 != 0; uVar9 = uVar9 - 8) {
    uVar2 = (uint)uVar4 ^ *puVar7;
    uVar1 = puVar7[1];
    puVar7 = puVar7 + 2;
    uVar4 = (ulong)(*(uint *)((long)crc32_slice8_table + (ulong)(uVar2 >> 6 & 0x3fc) + 0x1800) ^
                    crc32_slice8_table[(ulong)(uVar2 & 0xff) + 0x700] ^
                    *(uint *)((long)crc32_slice8_table + (ulong)(uVar2 >> 0xe & 0x3fc) + 0x1400) ^
                    *(uint *)((long)crc32_slice8_table +
                             (ulong)(uVar2 >> 0x16 & 0xfffffffc) + 0x1000) ^
                    crc32_slice8_table[(ulong)(uVar1 & 0xff) + 0x300] ^
                    *(uint *)((long)crc32_slice8_table + (ulong)(uVar1 >> 6 & 0x3fc) + 0x800) ^
                    *(uint *)((long)crc32_slice8_table + (ulong)(uVar1 >> 0xe & 0x3fc) + 0x400) ^
                   crc32_slice8_table[uVar1 >> 0x18]);
  }
  for (sVar6 = lVar5 + (sVar6 & 0xfffffffffffffff8); uVar3 = (u32)uVar4, len != sVar6;
      sVar6 = sVar6 + 1) {
    uVar4 = (ulong)(uVar3 >> 8 ^ crc32_slice8_table[(uint)p[sVar6] ^ uVar3 & 0xff]);
  }
  return uVar3;
}

Assistant:

static u32 MAYBE_UNUSED
crc32_slice8(u32 crc, const u8 *p, size_t len)
{
	const u8 * const end = p + len;
	const u8 *end64;

	for (; ((uintptr_t)p & 7) && p != end; p++)
		crc = (crc >> 8) ^ crc32_slice8_table[(u8)crc ^ *p];

	end64 = p + ((end - p) & ~7);
	for (; p != end64; p += 8) {
		u32 v1 = le32_bswap(*(const u32 *)(p + 0));
		u32 v2 = le32_bswap(*(const u32 *)(p + 4));

		crc = crc32_slice8_table[0x700 + (u8)((crc ^ v1) >> 0)] ^
		      crc32_slice8_table[0x600 + (u8)((crc ^ v1) >> 8)] ^
		      crc32_slice8_table[0x500 + (u8)((crc ^ v1) >> 16)] ^
		      crc32_slice8_table[0x400 + (u8)((crc ^ v1) >> 24)] ^
		      crc32_slice8_table[0x300 + (u8)(v2 >> 0)] ^
		      crc32_slice8_table[0x200 + (u8)(v2 >> 8)] ^
		      crc32_slice8_table[0x100 + (u8)(v2 >> 16)] ^
		      crc32_slice8_table[0x000 + (u8)(v2 >> 24)];
	}

	for (; p != end; p++)
		crc = (crc >> 8) ^ crc32_slice8_table[(u8)crc ^ *p];

	return crc;
}